

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall icu_63::RBBITableBuilder::exportTable(RBBITableBuilder *this,void *where)

{
  int iVar1;
  long lVar2;
  UBool UVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  undefined2 uVar8;
  uint index;
  
  if ((*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) && (*this->fTree != (RBBINode *)0x0)) {
    uVar4 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
    if (((int)uVar4 < 0x8000) && (iVar1 = this->fDStates->count, iVar1 < 0x8000)) {
      *(uint *)((long)where + 4) = uVar4 * 2 + 8;
      *(int *)where = iVar1;
      *(undefined4 *)((long)where + 8) = 0;
      *(uint *)((long)where + 8) = (uint)(this->fRB->fLookAheadHardBreak != '\0');
      UVar3 = RBBISetBuilder::sawBOF(this->fRB->fSetBuilder);
      if (UVar3 != '\0') {
        *(byte *)((long)where + 8) = *(byte *)((long)where + 8) | 2;
      }
      *(undefined4 *)((long)where + 0xc) = 0;
      if (*where != 0) {
        index = 0;
        do {
          pvVar5 = UVector::elementAt(this->fDStates,index);
          uVar6 = (ulong)(*(int *)((long)where + 4) * index);
          *(undefined2 *)((long)where + uVar6 + 0x10) = *(undefined2 *)((long)pvVar5 + 4);
          *(undefined2 *)((long)where + uVar6 + 0x12) = *(undefined2 *)((long)pvVar5 + 8);
          *(undefined2 *)((long)where + uVar6 + 0x14) = *(undefined2 *)((long)pvVar5 + 0x18);
          if (0 < (int)uVar4) {
            lVar2 = *(long *)((long)pvVar5 + 0x28);
            iVar1 = *(int *)(lVar2 + 8);
            uVar7 = 0;
            do {
              if ((long)uVar7 < (long)iVar1 && 0 < iVar1) {
                uVar8 = *(undefined2 *)(*(long *)(lVar2 + 0x18) + uVar7 * 4);
              }
              else {
                uVar8 = 0;
              }
              *(undefined2 *)((long)where + uVar7 * 2 + uVar6 + 0x18) = uVar8;
              uVar7 = uVar7 + 1;
            } while (uVar4 != uVar7);
          }
          index = index + 1;
        } while (index < *where);
      }
    }
    else {
      *this->fStatus = U_BRK_ERROR_START;
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::exportTable(void *where) {
    RBBIStateTable    *table = (RBBIStateTable *)where;
    uint32_t           state;
    int                col;

    if (U_FAILURE(*fStatus) || fTree == NULL) {
        return;
    }

    int32_t catCount = fRB->fSetBuilder->getNumCharCategories();
    if (catCount > 0x7fff ||
        fDStates->size() > 0x7fff) {
        *fStatus = U_BRK_INTERNAL_ERROR;
        return;
    }

    table->fRowLen    = offsetof(RBBIStateTableRow, fNextState) + sizeof(uint16_t) * catCount;
    table->fNumStates = fDStates->size();
    table->fFlags     = 0;
    if (fRB->fLookAheadHardBreak) {
        table->fFlags  |= RBBI_LOOKAHEAD_HARD_BREAK;
    }
    if (fRB->fSetBuilder->sawBOF()) {
        table->fFlags  |= RBBI_BOF_REQUIRED;
    }
    table->fReserved  = 0;

    for (state=0; state<table->fNumStates; state++) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
        RBBIStateTableRow   *row = (RBBIStateTableRow *)(table->fTableData + state*table->fRowLen);
        U_ASSERT (-32768 < sd->fAccepting && sd->fAccepting <= 32767);
        U_ASSERT (-32768 < sd->fLookAhead && sd->fLookAhead <= 32767);
        row->fAccepting = (int16_t)sd->fAccepting;
        row->fLookAhead = (int16_t)sd->fLookAhead;
        row->fTagIdx    = (int16_t)sd->fTagsIdx;
        for (col=0; col<catCount; col++) {
            row->fNextState[col] = (uint16_t)sd->fDtran->elementAti(col);
        }
    }
}